

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCanonicalizer.cpp
# Opt level: O3

Type * __thiscall
psy::C::TypeCanonicalizer::canonicalize(TypeCanonicalizer *this,Type *ty,Scope *scope)

{
  TypeKind TVar1;
  BasicTypeKind basicTyK;
  DeclarationCategory DVar2;
  TypeDeclarationCategory TVar3;
  TagTypeKind TVar4;
  TagTypeKind TVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TypedefDeclarationSymbol *pTVar8;
  FunctionType *this_00;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  Type *pTVar9;
  Type *pTVar10;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  TagDeclarationSymbol *pTVar11;
  undefined4 extraout_var_07;
  Compilation *pCVar12;
  TypeDeclarationSymbol *pTVar13;
  undefined4 extraout_var_09;
  Identifier *pIVar14;
  DeclarationSymbol *pDVar15;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  TagType *this_01;
  ostream *poVar16;
  SyntaxToken *__return_storage_ptr__;
  long lVar17;
  __hashtable *__h_2;
  __hashtable *__h;
  size_type idx;
  Type *elemTy;
  __node_gen_type __node_gen;
  Type *parmTy;
  Type *retTy;
  Type *local_148;
  vector<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_> local_140;
  Type *local_128;
  Type *local_120;
  Type *local_118;
  SyntaxToken local_110;
  SyntaxToken local_d8;
  SyntaxToken local_a0;
  SyntaxToken local_68;
  undefined4 extraout_var_01;
  undefined4 extraout_var_08;
  
  local_128 = ty;
  TVar1 = Type::kind(ty);
  switch(TVar1) {
  case Array:
    iVar6 = (*ty->_vptr_Type[3])(ty);
    pTVar9 = ArrayType::elementType((ArrayType *)CONCAT44(extraout_var,iVar6));
    local_148 = pTVar9;
    pTVar10 = canonicalize(this,pTVar9,scope);
    if (pTVar10 == pTVar9) {
      return local_128;
    }
    ArrayType::resetElementType((ArrayType *)CONCAT44(extraout_var,iVar6),pTVar10);
    break;
  case Basic:
    iVar6 = (*ty->_vptr_Type[5])(ty);
    pTVar9 = (Type *)CONCAT44(extraout_var_05,iVar6);
    pCVar12 = SemanticModel::compilation(this->semaModel_);
    basicTyK = BasicType::kind((BasicType *)pTVar9);
    pTVar10 = &Compilation::canonicalBasicType(pCVar12,basicTyK)->super_Type;
    goto LAB_002de12b;
  case Function:
    iVar6 = (*ty->_vptr_Type[7])(ty);
    this_00 = (FunctionType *)CONCAT44(extraout_var_01,iVar6);
    pTVar9 = FunctionType::returnType(this_00);
    local_118 = pTVar9;
    pTVar10 = canonicalize(this,pTVar9,scope);
    if (pTVar10 != pTVar9) {
      FunctionType::setReturnType(this_00,pTVar10);
      local_140.super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)&this->discardedTys_;
      std::
      _Hashtable<psy::C::Type_const*,psy::C::Type_const*,std::allocator<psy::C::Type_const*>,std::__detail::_Identity,std::equal_to<psy::C::Type_const*>,std::hash<psy::C::Type_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<psy::C::Type_const*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<psy::C::Type_const*,false>>>>
                ((_Hashtable<psy::C::Type_const*,psy::C::Type_const*,std::allocator<psy::C::Type_const*>,std::__detail::_Identity,std::equal_to<psy::C::Type_const*>,std::hash<psy::C::Type_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)local_140.
                    super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,&local_118);
    }
    FunctionType::parameterTypes(&local_140,this_00);
    if ((long)local_140.
              super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_140.
              super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar17 = (long)local_140.
                     super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_140.
                     super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3;
      idx = 0;
      do {
        local_120 = (Type *)(&((_Hashtable *)
                              local_140.
                              super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_buckets)[idx];
        pTVar9 = canonicalize(this,local_120,scope);
        if (pTVar9 != local_120) {
          FunctionType::setParameterType(this_00,idx,pTVar9);
          local_148 = (Type *)&this->discardedTys_;
          std::
          _Hashtable<psy::C::Type_const*,psy::C::Type_const*,std::allocator<psy::C::Type_const*>,std::__detail::_Identity,std::equal_to<psy::C::Type_const*>,std::hash<psy::C::Type_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<psy::C::Type_const*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<psy::C::Type_const*,false>>>>
                    ((_Hashtable<psy::C::Type_const*,psy::C::Type_const*,std::allocator<psy::C::Type_const*>,std::__detail::_Identity,std::equal_to<psy::C::Type_const*>,std::hash<psy::C::Type_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)&this->discardedTys_,&local_120,&local_148);
        }
        idx = idx + 1;
      } while (lVar17 + (ulong)(lVar17 == 0) != idx);
    }
    if ((unordered_set<const_psy::C::Type_*,_std::hash<const_psy::C::Type_*>,_std::equal_to<const_psy::C::Type_*>,_std::allocator<const_psy::C::Type_*>_>
         *)local_140.super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>
           ._M_impl.super__Vector_impl_data._M_start ==
        (unordered_set<const_psy::C::Type_*,_std::hash<const_psy::C::Type_*>,_std::equal_to<const_psy::C::Type_*>,_std::allocator<const_psy::C::Type_*>_>
         *)0x0) {
      return local_128;
    }
    operator_delete(local_140.
                    super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_140.
                          super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_140.
                          super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    return local_128;
  case Pointer:
    iVar6 = (*ty->_vptr_Type[9])(ty);
    pTVar9 = PointerType::referencedType((PointerType *)CONCAT44(extraout_var_02,iVar6));
    local_148 = pTVar9;
    pTVar10 = canonicalize(this,pTVar9,scope);
    if (pTVar10 == pTVar9) {
      return local_128;
    }
    PointerType::resetReferencedType((PointerType *)CONCAT44(extraout_var_02,iVar6),pTVar10);
    break;
  case TypedefName:
    iVar6 = (*ty->_vptr_Type[0xb])(ty);
    pTVar9 = (Type *)CONCAT44(extraout_var_00,iVar6);
    pTVar8 = TypedefNameType::declaration((TypedefNameType *)pTVar9);
    if (pTVar8 != (TypedefDeclarationSymbol *)0x0) {
      pTVar8 = TypedefNameType::declaration((TypedefNameType *)pTVar9);
      pTVar9 = &TypedefDeclarationSymbol::introducedSynonymType(pTVar8)->super_Type;
      return pTVar9;
    }
    pIVar14 = TypedefNameType::typedefName((TypedefNameType *)pTVar9);
    pDVar15 = Scope::searchForDeclaration(scope,pIVar14,OrdinaryIdentifiers);
    if (pDVar15 == (DeclarationSymbol *)0x0) {
      __return_storage_ptr__ = &local_a0;
      SyntaxNode::lastToken(__return_storage_ptr__,&this->tySpecNode_->super_SyntaxNode);
      DiagnosticsReporter::TypeDeclarationNotFound(&this->diagReporter_,__return_storage_ptr__);
    }
    else {
      DVar2 = DeclarationSymbol::category(pDVar15);
      if (DVar2 == Type) {
        iVar6 = (*(pDVar15->super_Symbol)._vptr_Symbol[0x17])(pDVar15);
        pTVar13 = (TypeDeclarationSymbol *)CONCAT44(extraout_var_08,iVar6);
        TVar3 = TypeDeclarationSymbol::category(pTVar13);
        if (TVar3 == Typedef) {
          iVar6 = (*(pTVar13->super_DeclarationSymbol).super_Symbol._vptr_Symbol[0x23])(pTVar13);
          pTVar10 = &TypedefDeclarationSymbol::introducedSynonymType
                               ((TypedefDeclarationSymbol *)CONCAT44(extraout_var_09,iVar6))->
                     super_Type;
          if (pTVar10 != pTVar9) {
            local_140.
            super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)&this->discardedTys_;
            local_148 = pTVar9;
            std::
            _Hashtable<psy::C::Type_const*,psy::C::Type_const*,std::allocator<psy::C::Type_const*>,std::__detail::_Identity,std::equal_to<psy::C::Type_const*>,std::hash<psy::C::Type_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<psy::C::Type_const*,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<psy::C::Type_const*,false>>>>
                      ((_Hashtable<psy::C::Type_const*,psy::C::Type_const*,std::allocator<psy::C::Type_const*>,std::__detail::_Identity,std::equal_to<psy::C::Type_const*>,std::hash<psy::C::Type_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)local_140.
                          super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
            pTVar9 = &TypedefDeclarationSymbol::introducedSynonymType
                                ((TypedefDeclarationSymbol *)CONCAT44(extraout_var_09,iVar6))->
                      super_Type;
            return pTVar9;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"[ASSERT] at ",0xc);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypeCanonicalizer.cpp"
                     ,0x60);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          iVar6 = 0xf4;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"[ASSERT] at ",0xc);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypeCanonicalizer.cpp"
                     ,0x60);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          iVar6 = 0xf2;
        }
        goto LAB_002de4e6;
      }
      __return_storage_ptr__ = &local_68;
      SyntaxNode::lastToken(__return_storage_ptr__,&this->tySpecNode_->super_SyntaxNode);
      DiagnosticsReporter::ExpectedTypedefDeclaration(&this->diagReporter_,__return_storage_ptr__);
    }
    goto LAB_002de318;
  case Tag:
    iVar6 = (*ty->_vptr_Type[0xd])(ty);
    pTVar9 = (Type *)CONCAT44(extraout_var_06,iVar6);
    pTVar11 = TagType::declaration((TagType *)pTVar9);
    if (pTVar11 != (TagDeclarationSymbol *)0x0) {
      pTVar11 = TagType::declaration((TagType *)pTVar9);
      pTVar9 = &TagDeclarationSymbol::introducedNewType(pTVar11)->super_Type;
      return pTVar9;
    }
    pIVar14 = TagType::tag((TagType *)pTVar9);
    pDVar15 = Scope::searchForDeclaration(scope,pIVar14,Tags);
    if (pDVar15 != (DeclarationSymbol *)0x0) {
      DVar2 = DeclarationSymbol::category(pDVar15);
      if (DVar2 == Type) {
        iVar6 = (*(pDVar15->super_Symbol)._vptr_Symbol[0x17])(pDVar15);
        pTVar13 = (TypeDeclarationSymbol *)CONCAT44(extraout_var_10,iVar6);
        TVar3 = TypeDeclarationSymbol::category(pTVar13);
        if (TVar3 == Tag) {
          iVar6 = (*(pTVar13->super_DeclarationSymbol).super_Symbol._vptr_Symbol[0x19])(pTVar13);
          pTVar11 = (TagDeclarationSymbol *)CONCAT44(extraout_var_11,iVar6);
          pTVar10 = &TagDeclarationSymbol::introducedNewType(pTVar11)->super_Type;
          if (pTVar10 != pTVar9) {
            TVar4 = TagType::kind((TagType *)pTVar9);
            this_01 = TagDeclarationSymbol::introducedNewType(pTVar11);
            TVar5 = TagType::kind(this_01);
            if (TVar4 == TVar5) {
              local_140.
              super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)&this->discardedTys_;
              local_148 = pTVar9;
              std::
              _Hashtable<psy::C::Type_const*,psy::C::Type_const*,std::allocator<psy::C::Type_const*>,std::__detail::_Identity,std::equal_to<psy::C::Type_const*>,std::hash<psy::C::Type_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              ::
              _M_insert<psy::C::Type_const*,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<psy::C::Type_const*,false>>>>
                        ();
              pTVar9 = &TagDeclarationSymbol::introducedNewType(pTVar11)->super_Type;
              pTVar9 = canonicalize(this,pTVar9,scope);
              return pTVar9;
            }
            __return_storage_ptr__ = &local_d8;
            SyntaxNode::lastToken(__return_storage_ptr__,&this->tySpecNode_->super_SyntaxNode);
            DiagnosticsReporter::TagTypeDoesNotMatchTagDeclaration
                      (&this->diagReporter_,__return_storage_ptr__);
            goto LAB_002de318;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"[ASSERT] at ",0xc);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypeCanonicalizer.cpp"
                     ,0x60);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          iVar6 = 0x111;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"[ASSERT] at ",0xc);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypeCanonicalizer.cpp"
                     ,0x60);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          iVar6 = 0x10f;
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypeCanonicalizer.cpp"
                   ,0x60);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        iVar6 = 0x10d;
      }
LAB_002de4e6:
      poVar16 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"<empty message>",0xf);
      std::endl<char,std::char_traits<char>>(poVar16);
      return ty;
    }
    __return_storage_ptr__ = &local_110;
    SyntaxNode::lastToken(__return_storage_ptr__,&this->tySpecNode_->super_SyntaxNode);
    DiagnosticsReporter::TypeDeclarationNotFound(&this->diagReporter_,__return_storage_ptr__);
LAB_002de318:
    SyntaxToken::~SyntaxToken(__return_storage_ptr__);
    pCVar12 = SemanticModel::compilation(this->semaModel_);
    pTVar9 = &Compilation::canonicalErrorType(pCVar12)->super_Type;
    return pTVar9;
  case Void:
    iVar6 = (*ty->_vptr_Type[0xf])(ty);
    pTVar9 = (Type *)CONCAT44(extraout_var_07,iVar6);
    pCVar12 = SemanticModel::compilation(this->semaModel_);
    pTVar10 = &Compilation::canonicalVoidType(pCVar12)->super_Type;
LAB_002de12b:
    if (pTVar10 == pTVar9) {
      return local_128;
    }
    local_140.super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)&this->discardedTys_;
    std::
    _Hashtable<psy::C::Type_const*,psy::C::Type_const*,std::allocator<psy::C::Type_const*>,std::__detail::_Identity,std::equal_to<psy::C::Type_const*>,std::hash<psy::C::Type_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<psy::C::Type_const*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<psy::C::Type_const*,false>>>>
              ((_Hashtable<psy::C::Type_const*,psy::C::Type_const*,std::allocator<psy::C::Type_const*>,std::__detail::_Identity,std::equal_to<psy::C::Type_const*>,std::hash<psy::C::Type_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)local_140.
                  super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>.
                  _M_impl.super__Vector_impl_data._M_start,&local_128);
    return pTVar10;
  case Qualified:
    iVar6 = (*ty->_vptr_Type[0x11])(ty);
    pTVar9 = QualifiedType::unqualifiedType((QualifiedType *)CONCAT44(extraout_var_03,iVar6));
    local_148 = pTVar9;
    pTVar10 = canonicalize(this,pTVar9,scope);
    if (pTVar10 == pTVar9) {
      return local_128;
    }
    TVar1 = Type::kind(pTVar10);
    if (TVar1 == Qualified) {
      iVar7 = (*pTVar10->_vptr_Type[0x11])(pTVar10);
      pTVar10 = QualifiedType::unqualifiedType((QualifiedType *)CONCAT44(extraout_var_04,iVar7));
    }
    QualifiedType::resetUnqualifiedType((QualifiedType *)CONCAT44(extraout_var_03,iVar6),pTVar10);
    break;
  default:
    goto switchD_002dde74_default;
  }
  local_140.super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&this->discardedTys_;
  std::
  _Hashtable<psy::C::Type_const*,psy::C::Type_const*,std::allocator<psy::C::Type_const*>,std::__detail::_Identity,std::equal_to<psy::C::Type_const*>,std::hash<psy::C::Type_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_insert<psy::C::Type_const*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<psy::C::Type_const*,false>>>>
            ((_Hashtable<psy::C::Type_const*,psy::C::Type_const*,std::allocator<psy::C::Type_const*>,std::__detail::_Identity,std::equal_to<psy::C::Type_const*>,std::hash<psy::C::Type_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)local_140.
                super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>.
                _M_impl.super__Vector_impl_data._M_start,&local_148);
switchD_002dde74_default:
  return local_128;
}

Assistant:

const Type* TypeCanonicalizer::canonicalize(const Type* ty, const Scope* scope)
{
    switch (ty->kind()) {
        case TypeKind::Array: {
            auto arrTy = ty->asArrayType();
            auto elemTy = arrTy->elementType();
            auto canonTy = canonicalize(elemTy, scope);
            if (canonTy != elemTy) {
                arrTy->resetElementType(canonTy);
                discardedTys_.insert(elemTy);
            }
            break;
        }

        case TypeKind::Basic: {
            auto basicTy = ty->asBasicType();
            auto canonTy =
                semaModel_->compilation()->canonicalBasicType(basicTy->kind());
            if (canonTy != basicTy) {
                discardedTys_.insert(ty);
                return canonTy;
            }
            break;
        }

        case TypeKind::Void: {
            auto voidTy = ty->asVoidType();
            auto canonTy = semaModel_->compilation()->canonicalVoidType();
            if (canonTy != voidTy) {
                discardedTys_.insert(ty);
                return canonTy;
            }
            break;
        }

        case TypeKind::Function: {
            auto funcTy = ty->asFunctionType();
            auto retTy = funcTy->returnType();
            auto canonTy = canonicalize(retTy, scope);
            if (canonTy != retTy) {
                funcTy->setReturnType(canonTy);
                discardedTys_.insert(retTy);
            }
            const auto parms = funcTy->parameterTypes();
            const auto parmsSize = parms.size();
            for (FunctionType::ParameterTypes::size_type idx = 0; idx < parmsSize; ++idx) {
                const Type* parmTy = parms[idx];
                canonTy = canonicalize(parmTy, scope);
                if (canonTy != parmTy) {
                    funcTy->setParameterType(idx, canonTy);
                    discardedTys_.insert(parmTy);
                }
            }
            break;
        }

        case TypeKind::Pointer: {
            auto ptrTy = ty->asPointerType();
            auto refedTy = ptrTy->referencedType();
            auto canonTy = canonicalize(refedTy, scope);
            if (canonTy != refedTy) {
                ptrTy->resetReferencedType(canonTy);
                discardedTys_.insert(refedTy);
            }
            break;
        }

        case TypeKind::TypedefName: {
            auto tydefNameTy = ty->asTypedefNameType();
            if (tydefNameTy->declaration())
                return tydefNameTy->declaration()->introducedSynonymType();
            auto tydefName = tydefNameTy->typedefName();
            auto decl = scope->searchForDeclaration(
                        tydefName,
                        NameSpace::OrdinaryIdentifiers);
            if (decl) {
                if (decl->category() == DeclarationCategory::Type) {
                    auto tyDecl = decl->asTypeDeclaration();
                    // A type declaration found under the ordinary identifiers
                    // namespace must be that of a typedef.
                    PSY_ASSERT_2(tyDecl->category() == TypeDeclarationCategory::Typedef, return ty);
                    auto tydef = tyDecl->asTypedefDeclaration();
                    PSY_ASSERT_2(tydef->introducedSynonymType() != tydefNameTy, return ty);
                    discardedTys_.insert(tydefNameTy);
                    return tydef->introducedSynonymType();
                }
                //if (tree_->completeness() == TextCompleteness::Full)
                diagReporter_.ExpectedTypedefDeclaration(tySpecNode_->lastToken());
            }
            else {
                //if (tree_->completeness() == TextCompleteness::Full)
                diagReporter_.TypeDeclarationNotFound(tySpecNode_->lastToken());
            }
            return semaModel_->compilation()->canonicalErrorType();
        }

        case TypeKind::Tag: {
            auto tagTy = ty->asTagType();
            if (tagTy->declaration())
                return tagTy->declaration()->introducedNewType();
            auto tag = tagTy->tag();
            auto decl = scope->searchForDeclaration(
                        tag,
                        NameSpace::Tags);
            if (decl) {
                // A declaration found under the tags name space must be that
                // of a tag type declaration.
                PSY_ASSERT_2(decl->category() == DeclarationCategory::Type, return ty);
                auto tyDecl = decl->asTypeDeclaration();
                PSY_ASSERT_2(tyDecl->category() == TypeDeclarationCategory::Tag, return ty);
                auto tagDecl = tyDecl->asTagTypeDeclaration();
                PSY_ASSERT_2(tagDecl->introducedNewType() != tagTy, return ty);
                if (tagTy->kind() == tagDecl->introducedNewType()->kind()) {
                    discardedTys_.insert(tagTy);
                    return canonicalize(tagDecl->introducedNewType(), scope);
                }
                //if (tree_->completeness() == TextCompleteness::Full)
                diagReporter_.TagTypeDoesNotMatchTagDeclaration(tySpecNode_->lastToken());
            } else {
                //if (tree_->completeness() == TextCompleteness::Full)
                diagReporter_.TypeDeclarationNotFound(tySpecNode_->lastToken());
            }
            return semaModel_->compilation()->canonicalErrorType();
        }

        case TypeKind::Qualified: {
            auto qualTy = ty->asQualifiedType();
            auto unqualTy = qualTy->unqualifiedType();
            auto canonTy = canonicalize(unqualTy, scope);
            if (canonTy != unqualTy) {
                qualTy->resetUnqualifiedType(
                        canonTy->kind() == TypeKind::Qualified
                            ? canonTy->asQualifiedType()->unqualifiedType()
                            : canonTy);
                discardedTys_.insert(unqualTy);
            }
            break;
        }

        case TypeKind::Error:
            break;
    }

    return ty;
}